

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
                *this)

{
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar2;
  
  if ((((this->left_->fadexpr_).right_)->dx_).num_elts != 0) {
    pFVar1 = (this->right_->fadexpr_).left_;
    pFVar2 = (pFVar1->fadexpr_).left_;
    if (((((pFVar2->fadexpr_).left_)->dx_).num_elts != 0) &&
       ((((pFVar2->fadexpr_).right_)->dx_).num_elts != 0)) {
      return (((pFVar1->fadexpr_).right_)->dx_).num_elts != 0;
    }
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}